

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O2

double ** one_two(double *input,int row,int col)

{
  double **ppdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  ppdVar1 = Make2DArray(row,col);
  uVar2 = 0;
  uVar3 = (ulong)(uint)col;
  if (col < 1) {
    uVar3 = uVar2;
  }
  uVar4 = 0;
  if (0 < row) {
    uVar4 = (ulong)(uint)row;
  }
  for (; uVar2 != uVar4; uVar2 = uVar2 + 1) {
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      ppdVar1[uVar2][uVar5] = input[uVar5];
    }
    input = input + row;
  }
  return ppdVar1;
}

Assistant:

double** one_two(double* input,int row,int col){
    double** output = Make2DArray(row,col);
    for(int i = 0;i < row;i++)
        for(int j = 0;j < col;j++)
            output[i][j] = input[i * row + j];
    return output;
}